

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

bool __thiscall HModel::allNonbasicMoveVsWorkArrays_OK(HModel *this)

{
  bool bVar1;
  int var;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    printf("NonbasicMoveVsWorkArrays: var = %2d; nonbasicFlag[var] = %2d\n",uVar2 & 0xffffffff,
           (ulong)(uint)(this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar2]);
    if (((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar2] != 0) &&
       (bVar1 = oneNonbasicMoveVsWorkArrays_OK(this,(int)uVar2), !bVar1)) break;
    uVar2 = uVar2 + 1;
    if ((long)this->numTot <= (long)uVar2) {
      return true;
    }
  }
  printf("Error in NonbasicMoveVsWorkArrays for nonbasic variable %d\n",uVar2 & 0xffffffff);
  std::ostream::flush();
  return false;
}

Assistant:

bool HModel::allNonbasicMoveVsWorkArrays_OK() {
  bool ok;
  for (int var = 0; var < numTot; ++var) {
    printf("NonbasicMoveVsWorkArrays: var = %2d; nonbasicFlag[var] = %2d\n", var, nonbasicFlag[var]);
    if (!nonbasicFlag[var]) continue;
    ok = oneNonbasicMoveVsWorkArrays_OK(var);
    if (!ok) {
      printf("Error in NonbasicMoveVsWorkArrays for nonbasic variable %d\n", var);cout << flush;
#ifdef JAJH_dev
      assert(ok);
#endif
      return ok;
    }
  }
  //ok must be true if we reach here
  assert(ok);
  return ok;
}